

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::TParseContext::fixIoArraySize(TParseContext *this,TSourceLoc *loc,TType *type)

{
  TSymbolTable *pTVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  iVar3 = (*type->_vptr_TType[0x1d])(type);
  if ((char)iVar3 != '\0') {
    iVar3 = (*type->_vptr_TType[10])(type);
    if (((*(byte *)(CONCAT44(extraout_var,iVar3) + 0xd) & 0x10) == 0) &&
       (pTVar1 = (this->super_TParseContextBase).symbolTable,
       3 < (int)((ulong)((long)(pTVar1->table).
                               super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pTVar1->table).
                              super__Vector_base<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3))) {
      bVar2 = isIoResizeArray(this,type);
      if (bVar2) {
        __assert_fail("! isIoResizeArray(type)",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/ParseHelper.cpp"
                      ,0x2e6,
                      "void glslang::TParseContext::fixIoArraySize(const TSourceLoc &, TType &)");
      }
      iVar3 = (*type->_vptr_TType[10])(type);
      if ((*(uint *)(CONCAT44(extraout_var_00,iVar3) + 8) & 0x7f) == 3) {
        iVar3 = (*type->_vptr_TType[10])(type);
        if (((*(ulong *)(CONCAT44(extraout_var_01,iVar3) + 8) & 0x100000000000) == 0) &&
           ((this->super_TParseContextBase).super_TParseVersions.language - EShLangTessControl < 2))
        {
          iVar3 = (*type->_vptr_TType[0xf])(type);
          if (iVar3 != (this->resources).maxPatchVertices) {
            iVar3 = (*type->_vptr_TType[0x1e])(type);
            if ((char)iVar3 != '\0') {
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,
                         "tessellation input array size must be gl_MaxPatchVertices or implicitly sized"
                         ,"[]","");
            }
            TType::changeOuterArraySize(type,(this->resources).maxPatchVertices);
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void TParseContext::fixIoArraySize(const TSourceLoc& loc, TType& type)
{
    if (! type.isArray() || type.getQualifier().patch || symbolTable.atBuiltInLevel())
        return;

    assert(! isIoResizeArray(type));

    if (type.getQualifier().storage != EvqVaryingIn || type.getQualifier().patch)
        return;

    if (language == EShLangTessControl || language == EShLangTessEvaluation) {
        if (type.getOuterArraySize() != resources.maxPatchVertices) {
            if (type.isSizedArray())
                error(loc, "tessellation input array size must be gl_MaxPatchVertices or implicitly sized", "[]", "");
            type.changeOuterArraySize(resources.maxPatchVertices);
        }
    }
}